

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::ComputeSimdScope(CWriter *this)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  const_iterator __first;
  const_iterator __last;
  bool local_69;
  bool local_59;
  CWriter *this_local;
  
  local_59 = false;
  if (((this->module_->features_used).simd & 1U) != 0) {
    cVar2 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::begin
                      (&this->module_->globals);
    cVar3 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::end
                      (&this->module_->globals);
    bVar1 = std::
            any_of<__gnu_cxx::__normal_iterator<wabt::Global*const*,std::vector<wabt::Global*,std::allocator<wabt::Global*>>>,wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__0>
                      (cVar2._M_current,cVar3._M_current);
    local_69 = true;
    if (!bVar1) {
      cVar4 = std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>::begin
                        (&this->module_->imports);
      cVar5 = std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>::end
                        (&this->module_->imports);
      bVar1 = std::
              any_of<__gnu_cxx::__normal_iterator<wabt::Import*const*,std::vector<wabt::Import*,std::allocator<wabt::Import*>>>,wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__1>
                        (cVar4._M_current,cVar5._M_current);
      local_69 = true;
      if (!bVar1) {
        __first = std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::begin
                            (&this->module_->exports);
        __last = std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::end
                           (&this->module_->exports);
        local_69 = std::
                   any_of<__gnu_cxx::__normal_iterator<wabt::Export*const*,std::vector<wabt::Export*,std::allocator<wabt::Export*>>>,wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__2>
                             ((__normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                               )__first._M_current,
                              (__normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                               )__last._M_current,(anon_class_8_1_8991fb9c_for__M_pred)this);
      }
    }
    local_59 = local_69;
  }
  this->simd_used_in_header_ = local_59;
  return;
}

Assistant:

void CWriter::ComputeSimdScope() {
  simd_used_in_header_ =
      module_->features_used.simd &&
      (std::any_of(module_->globals.begin(), module_->globals.end(),
                   [](const auto& x) { return x->type == Type::V128; }) ||
       std::any_of(module_->imports.begin(), module_->imports.end(),
                   [](const auto& x) {
                     return x->kind() == ExternalKind::Func &&
                            func_uses_simd(cast<FuncImport>(x)->func.decl.sig);
                   }) ||
       std::any_of(module_->exports.begin(), module_->exports.end(),
                   [&](const auto& x) {
                     return x->kind == ExternalKind::Func &&
                            func_uses_simd(module_->GetFunc(x->var)->decl.sig);
                   }));
}